

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr.cpp
# Opt level: O1

void __thiscall pg::RRSolver::run(RRSolver *this)

{
  Game *pGVar1;
  uint64_t *puVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  int *piVar13;
  int *__s;
  int *piVar14;
  ostream *poVar15;
  uint p;
  long lVar16;
  uint i;
  ulong uVar17;
  pointer *ppiVar18;
  
  pGVar1 = (this->super_PPSolver).super_Solver.game;
  iVar8 = *(int *)((long)pGVar1->_priority + ((pGVar1->n_vertices << 0x20) + -0x100000000 >> 0x1e));
  uVar17 = (ulong)(iVar8 + 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar17;
  uVar10 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar11 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar11 = 0xffffffffffffffff;
  }
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar12 = (ulong *)operator_new__(uVar11);
  *puVar12 = uVar17;
  if (iVar8 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar12 + 1),0,
           ((uVar17 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  (this->super_PPSolver).regions = (vector<int,_std::allocator<int>_> *)(puVar12 + 1);
  piVar13 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                  pGVar1->n_vertices << 2);
  (this->super_PPSolver).region = piVar13;
  __s = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                              pGVar1->n_vertices << 2);
  (this->super_PPSolver).strategy = __s;
  uVar17 = uVar17 << 2;
  if (iVar8 < -1) {
    uVar17 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar17);
  (this->super_PPSolver).inverse = piVar14;
  uVar10 = pGVar1->n_vertices;
  if (0 < (long)uVar10) {
    puVar2 = ((this->super_PPSolver).super_Solver.disabled)->_bits;
    uVar11 = 0;
    do {
      iVar8 = -2;
      if ((puVar2[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
        iVar8 = pGVar1->_priority[uVar11];
      }
      piVar13[uVar11] = iVar8;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if (0 < (long)uVar10) {
    memset(__s,0xff,uVar10 * 4);
  }
  uVar10 = (ulong)((int)uVar10 - 1);
  (this->super_PPSolver).promotions = 0;
  do {
    if ((int)uVar10 < 0) break;
    piVar13 = ((this->super_PPSolver).super_Solver.game)->_priority;
    p = piVar13[uVar10];
    do {
      i = (uint)uVar10;
      if ((piVar13[uVar10] != p) ||
         (((((this->super_PPSolver).super_Solver.disabled)->_bits[uVar10 >> 6] >> (uVar10 & 0x3f) &
           1) == 0 && ((this->super_PPSolver).region[uVar10] <= (int)p)))) goto LAB_0015ddf3;
      uVar10 = (ulong)(i - 1);
    } while (0 < (int)i);
    i = 0xffffffff;
LAB_0015ddf3:
    uVar10 = 0xffffffff;
    if (-1 < (int)i) {
      if (piVar13[i] == p) {
        (this->super_PPSolver).inverse[(int)p] = i;
        iVar8 = (*(this->super_PPSolver).super_Solver._vptr_Solver[5])(this,(ulong)p);
        bVar7 = PPSolver::setupRegion(&this->super_PPSolver,i,p,(bool)((byte)iVar8 ^ 1));
        if (bVar7) {
          uVar10 = (ulong)i;
          do {
            if (1 < (this->super_PPSolver).super_Solver.trace) {
              PPSolver::reportRegion(&this->super_PPSolver,p);
            }
            uVar9 = (*(this->super_PPSolver).super_Solver._vptr_Solver[4])(this,uVar10,(ulong)p);
            if (uVar9 == 0xffffffff) {
              PPSolver::setDominion(&this->super_PPSolver,p);
              uVar10 = (ulong)((int)((this->super_PPSolver).super_Solver.game)->n_vertices - 1);
LAB_0015dea6:
              bVar7 = false;
            }
            else {
              if (uVar9 == 0xfffffffe) {
                if (-1 < (int)uVar10) {
                  do {
                    iVar8 = (int)uVar10;
                    if (((this->super_PPSolver).super_Solver.game)->_priority[uVar10] != p)
                    goto LAB_0015dea6;
                    uVar10 = (ulong)(iVar8 - 1);
                  } while (0 < iVar8);
                  uVar10 = 0xffffffff;
                }
                goto LAB_0015dea6;
              }
              if (1 < (this->super_PPSolver).super_Solver.trace) {
                PPSolver::printState(&this->super_PPSolver);
              }
              PPSolver::promote(&this->super_PPSolver,p,uVar9);
              if (1 < (this->super_PPSolver).super_Solver.trace) {
                PPSolver::printState(&this->super_PPSolver);
              }
              uVar10 = (ulong)(uint)(this->super_PPSolver).inverse[(int)uVar9];
              bVar7 = true;
              p = uVar9;
            }
          } while (bVar7);
        }
        else {
          uVar9 = i;
          do {
            uVar10 = (ulong)uVar9;
            if (((this->super_PPSolver).super_Solver.game)->_priority[uVar9] != p) break;
            bVar7 = 0 < (int)uVar9;
            uVar10 = 0xffffffff;
            uVar9 = uVar9 - 1;
          } while (bVar7);
        }
      }
      else {
        pvVar3 = (this->super_PPSolver).regions;
        uVar10 = (ulong)i;
        if (pvVar3[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            pvVar3[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          PPSolver::resetRegion(&this->super_PPSolver,p);
          uVar10 = (ulong)i;
        }
      }
    }
  } while (-1 < (int)i);
  pvVar3 = (this->super_PPSolver).regions;
  if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar4 = pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar18 = &pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar4 != (pointer)0x0) {
      lVar16 = (long)piVar4 * 0x18;
      do {
        pvVar5 = *(void **)((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar16);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)ppiVar18 + lVar16) - (long)pvVar5);
        }
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != 0);
    }
    operator_delete__(ppiVar18,(long)piVar4 * 0x18 + 8);
  }
  piVar13 = (this->super_PPSolver).region;
  if (piVar13 != (int *)0x0) {
    operator_delete__(piVar13);
  }
  piVar13 = (this->super_PPSolver).strategy;
  if (piVar13 != (int *)0x0) {
    operator_delete__(piVar13);
  }
  piVar13 = (this->super_PPSolver).inverse;
  if (piVar13 != (int *)0x0) {
    operator_delete__(piVar13);
  }
  poVar15 = (this->super_PPSolver).super_Solver.logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"solved with ",0xc);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,(this->super_PPSolver).promotions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," promotions.",0xc);
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  return;
}

Assistant:

void
RRSolver::run()
{
    // obtain highest priority and allocate arrays
    int max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // RR: only reset the region if:
        // - current node is promoted or attracted
        // - or region is empty
        // - or region does not fulfill conditions
        // This is checked by checkRegion()
        if (setupRegion(i, p, !checkRegion(p))) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion, return
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    break;
                } else {
                    // found promotion, promote
                    if (trace >= 2) printState();
                    promote(p, res);
                    if (trace >= 2) printState();
                    // continue inner loop with the higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}